

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                    (PointerBuilder builder,ListSchema schema)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  StructPointerCount SVar3;
  undefined1 uVar4;
  ListElementCount LVar5;
  BitsPerElementN<23> BVar6;
  ElementSize EVar7;
  Which elementType;
  uint uVar8;
  uint uVar9;
  anon_union_8_2_eba6ea51_for_Type_5 in_RDX;
  ulong in_RSI;
  Builder *in_RDI;
  ListBuilder *__return_storage_ptr__;
  Type local_c0;
  Schema local_b0;
  Reader local_a8;
  ListBuilder local_78;
  ListBuilder local_50;
  
  if ((Which)in_RSI == STRUCT && (in_RSI & 0xff0000) == 0) {
    local_b0.raw = (RawBrandedSchema *)Type::asStruct(&local_c0);
    Schema::getProto(&local_a8,&local_b0);
    uVar8 = 0;
    if (local_a8._reader.dataSize < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = (uint)*(ushort *)((long)local_a8._reader.data + 0xe);
      if (0xcf < local_a8._reader.dataSize) {
        uVar8 = (uint)*(ushort *)((long)local_a8._reader.data + 0x18) << 0x10;
      }
    }
    __return_storage_ptr__ = &local_50;
    PointerBuilder::getStructList
              (__return_storage_ptr__,(PointerBuilder *)&schema,(StructSize)(uVar9 | uVar8),
               (word *)0x0);
  }
  else {
    elementType = LIST;
    if ((in_RSI & 0xff0000) == 0) {
      elementType = (Which)in_RSI;
    }
    EVar7 = anon_unknown_71::elementSizeFor(elementType);
    __return_storage_ptr__ = &local_78;
    PointerBuilder::getList(__return_storage_ptr__,(PointerBuilder *)&schema,EVar7,(word *)0x0);
  }
  SVar3 = __return_storage_ptr__->structPointerCount;
  EVar7 = __return_storage_ptr__->elementSize;
  uVar4 = __return_storage_ptr__->field_0x27;
  (in_RDI->builder).structDataSize = __return_storage_ptr__->structDataSize;
  (in_RDI->builder).structPointerCount = SVar3;
  (in_RDI->builder).elementSize = EVar7;
  (in_RDI->builder).field_0x27 = uVar4;
  pSVar1 = __return_storage_ptr__->segment;
  pCVar2 = __return_storage_ptr__->capTable;
  LVar5 = __return_storage_ptr__->elementCount;
  BVar6 = __return_storage_ptr__->step;
  (in_RDI->builder).ptr = __return_storage_ptr__->ptr;
  (in_RDI->builder).elementCount = LVar5;
  (in_RDI->builder).step = BVar6;
  (in_RDI->builder).segment = pSVar1;
  (in_RDI->builder).capTable = pCVar2;
  (in_RDI->schema).elementType.baseType = (short)in_RSI;
  (in_RDI->schema).elementType.listDepth = (char)(in_RSI >> 0x10);
  (in_RDI->schema).elementType.isImplicitParam = (bool)(char)(in_RSI >> 0x18);
  (in_RDI->schema).elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(in_RSI >> 0x20)
  ;
  *(short *)&(in_RDI->schema).elementType.field_0x6 = (short)(in_RSI >> 0x30);
  (in_RDI->schema).elementType.field_4 = in_RDX;
  return in_RDI;
}

Assistant:

DynamicList::Builder PointerHelpers<DynamicList, Kind::OTHER>::getDynamic(
    PointerBuilder builder, ListSchema schema) {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(schema,
        builder.getStructList(
            structSizeFromSchema(schema.getStructElementType()),
            nullptr));
  } else {
    return DynamicList::Builder(schema,
        builder.getList(elementSizeFor(schema.whichElementType()), nullptr));
  }
}